

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

void __thiscall
GdlGlyphDefn::AssignGlyphAttrsToClassMembers
          (GdlGlyphDefn *this,GrcGlyphAttrMatrix *pgax,GdlRenderer *prndr,
          GrcLigComponentList *plclist,
          vector<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_> *vpglfaAttrs,
          int cgid,int *igid)

{
  gid16 wGlyphID;
  int nAttrID;
  pointer ppGVar1;
  GrcSymbolTableEntry *this_00;
  GdlAssignment *pGVar2;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  GdlGlyphAttrSetting *pGVar7;
  GdlExpression *pGVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar9;
  Symbol psymComponent;
  ulong uVar10;
  GdlExpression *pGVar11;
  bool fOverrideOld;
  allocator local_f6;
  bool fShadow;
  int local_f4;
  GdlExpression *local_f0;
  ExpressionType local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  vector<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_> *local_d8;
  GrcGlyphAttrMatrix *local_d0;
  ulong local_c8;
  GdlRenderer *local_c0;
  GrcLigComponentList *local_b8;
  GdlExpression *pexpOld;
  int mPrUnitsOld;
  int nPROld;
  GrpLineAndFile lnfOld;
  GrpLineAndFile lnfNew;
  string local_50;
  
  local_e4 = *igid;
  uVar10 = 0;
  local_e8 = cgid;
  local_d8 = vpglfaAttrs;
  local_d0 = pgax;
  local_c0 = prndr;
  local_b8 = plclist;
  do {
    ppGVar1 = (local_d8->
              super__Vector_base<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_d8->
                      super__Vector_base<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3) <= uVar10) {
      return;
    }
    pGVar7 = ppGVar1[uVar10];
    this_00 = pGVar7->m_psym;
    nAttrID = this_00->m_nInternalID;
    if (g_cman.m_fOffsetAttrs == false) {
      bVar4 = GrcSymbolTableEntry::IsIgnorableOffsetAttr(this_00);
      if (!bVar4) {
        pGVar7 = (local_d8->
                 super__Vector_base<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar10];
        goto LAB_00121237;
      }
    }
    else {
LAB_00121237:
      pGVar2 = pGVar7->m_pasgn;
      pGVar11 = (pGVar2->super_GrcAssignment).m_pexp;
      local_dc = (pGVar2->super_GrcAssignment).m_nPointRadius;
      local_e0 = (pGVar2->super_GrcAssignment).m_mPrUnits;
      bVar4 = (pGVar2->super_GrcAssignment).m_fOverride;
      GrpLineAndFile::GrpLineAndFile(&lnfNew,&(pGVar2->super_GrcAssignment).m_lnf);
      local_f4 = lnfNew.m_nLinePre;
      local_c8 = uVar10;
      if (pGVar11 == (GdlExpression *)0x0) {
        local_f0 = (GdlExpression *)0x0;
        pGVar11 = (GdlExpression *)0x0;
      }
      else {
        pGVar8 = (GdlExpression *)
                 __dynamic_cast(pGVar11,&GdlExpression::typeinfo,&GdlClassMemberExpression::typeinfo
                                ,0);
        if (pGVar8 == (GdlExpression *)0x0) {
          local_f0 = (GdlExpression *)0x0;
        }
        else {
          pGVar8[1].m_exptResult = local_e8;
          iVar5 = *(int *)((long)&pGVar8[1].super_GdlObject.m_lnf.m_staFile.field_2 + 0xc);
          iVar6 = *igid;
          if (iVar5 != iVar6 && iVar5 != -1) {
            iVar5 = (**pGVar8->_vptr_GdlExpression)(pGVar8);
            if (CONCAT44(extraout_var,iVar5) == 0) {
              pGVar8 = (GdlExpression *)0x0;
            }
            else {
              pGVar8 = (GdlExpression *)
                       __dynamic_cast(CONCAT44(extraout_var,iVar5),&GdlExpression::typeinfo,
                                      &GdlClassMemberExpression::typeinfo,0);
            }
            GrcManager::StoreModifiedExpression(&g_cman,pGVar8);
            iVar6 = *igid;
            pGVar11 = pGVar8;
          }
          *(int *)((long)&pGVar8[1].super_GdlObject.m_lnf.m_staFile.field_2 + 0xc) = iVar6;
          local_f0 = pGVar8;
        }
      }
      *igid = local_e4;
      for (uVar10 = 0;
          puVar3 = (this->m_vwGlyphIDs).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar10 < (ulong)((long)(this->m_vwGlyphIDs).
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 1);
          uVar10 = uVar10 + 1) {
        if (puVar3[uVar10] != 0xfffb) {
          lnfOld.m_nLinePre = -1;
          lnfOld.m_nLineOrig = -1;
          lnfOld.m_staFile._M_dataplus._M_p = (pointer)&lnfOld.m_staFile.field_2;
          lnfOld.m_staFile._M_string_length = 0;
          lnfOld.m_staFile.field_2._M_local_buf[0] = '\0';
          GrcGlyphAttrMatrix::Get
                    (local_d0,puVar3[uVar10],nAttrID,&pexpOld,&nPROld,&mPrUnitsOld,&fOverrideOld,
                     &fShadow,&lnfOld);
          if (((pexpOld == (GdlExpression *)0x0) || ((lnfOld.m_nLinePre < local_f4 & bVar4) != 0))
             || ((local_f4 < lnfOld.m_nLinePre && (fOverrideOld == false)))) {
            pGVar8 = pGVar11;
            if ((local_f0 != (GdlExpression *)0x0) &&
               (*(int *)((long)&local_f0[1].super_GdlObject.m_lnf.m_staFile.field_2 + 0xc) != *igid)
               ) {
              iVar5 = (**pGVar11->_vptr_GdlExpression)(pGVar11);
              pGVar8 = (GdlExpression *)CONCAT44(extraout_var_00,iVar5);
              lVar9 = __dynamic_cast(pGVar8,&GdlExpression::typeinfo,
                                     &GdlClassMemberExpression::typeinfo,0);
              *(int *)(lVar9 + 100) = *igid;
              GrcManager::StoreModifiedExpression(&g_cman,pGVar8);
            }
            GrcGlyphAttrMatrix::Set
                      (local_d0,(this->m_vwGlyphIDs).
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar10],nAttrID,pGVar8,
                       local_dc,local_e0,bVar4,false,&lnfNew);
          }
          std::__cxx11::string::string((string *)&local_50,"component",&local_f6);
          iVar5 = GrcSymbolTableEntry::FieldIndex(this_00,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (-1 < iVar5) {
            wGlyphID = (this->m_vwGlyphIDs).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10];
            psymComponent = GrcSymbolTableEntry::BaseLigComponent(this_00->m_psymGeneric);
            GrcLigComponentList::AddComponentFor(local_b8,wGlyphID,psymComponent,local_c0);
          }
          *igid = *igid + 1;
          std::__cxx11::string::~string((string *)&lnfOld.m_staFile);
        }
      }
      std::__cxx11::string::~string((string *)&lnfNew.m_staFile);
      uVar10 = local_c8;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void GdlGlyphDefn::AssignGlyphAttrsToClassMembers(GrcGlyphAttrMatrix * pgax,
	GdlRenderer * prndr, GrcLigComponentList * plclist,
	std::vector<GdlGlyphAttrSetting *> & vpglfaAttrs, int cgid, int & igid)
{
	int igidInitial = igid;

	//	For each attribute assignment in the value list:
	for (size_t ipglfa = 0; ipglfa < vpglfaAttrs.size(); ipglfa++)
	{
		Symbol psym = vpglfaAttrs[ipglfa]->GlyphSymbol();
		Assert(!psym->IsGeneric());
		int nGlyphAttrID = psym->InternalID();

		if (!g_cman.OffsetAttrs() && psym->IsIgnorableOffsetAttr())
			continue;

		//	The new attribute assignment:
		GdlAssignment * pasgnValue = vpglfaAttrs[ipglfa]->Assignment();
		GdlExpression * pexpNew = pasgnValue->Expression();
		int nPRNew = pasgnValue->PointRadius();
		int mPrUnitsNew = pasgnValue->PointRadiusUnits();
		bool fOverrideNew = pasgnValue->Override();
		GrpLineAndFile lnfNew = pasgnValue->LineAndFile();
		int nStmtNoNew = lnfNew.PreProcessedLine();

		GdlClassMemberExpression * pexpilNew = dynamic_cast<GdlClassMemberExpression *>(pexpNew);
		if (pexpilNew)
		{
			Assert(pexpilNew->Name()->FitsSymbolType(ksymtClass));
			pexpilNew->SetClassSize(cgid);
			if (pexpilNew->GlyphIndex() != -1 && pexpilNew->GlyphIndex() != igid)
			{
				//	Make a copy for this specific glyph definition.
				GdlClassMemberExpression * pexpilThisGlyphId 
					= dynamic_cast<GdlClassMemberExpression *>(pexpilNew->Clone());
				pexpilNew = pexpilThisGlyphId;
				pexpNew = dynamic_cast<GdlExpression *>(pexpilNew);
				g_cman.StoreModifiedExpression(pexpNew);
			}
			pexpilNew->SetGlyphIndex(igid);
		}

		igid = igidInitial;	// start over for each attribute

		//	For each glyph ID covered by this definition's range:
		for (size_t iwGlyphID = 0; iwGlyphID < m_vwGlyphIDs.size(); iwGlyphID++)
		{
			if (m_vwGlyphIDs[iwGlyphID] == kBadGlyph) // invalid glyph
				continue;

			//	Compare the new assignment with the previous.
			GdlExpression * pexpOld;
			int nPROld;
			int mPrUnitsOld;
			bool fOverrideOld, fShadow;
			GrpLineAndFile lnfOld;
			pgax->Get(m_vwGlyphIDs[iwGlyphID], nGlyphAttrID,
				&pexpOld, &nPROld, &mPrUnitsOld, &fOverrideOld, &fShadow, &lnfOld);
			int nStmtNoOld = lnfOld.PreProcessedLine();
			Assert(!fShadow);

			if (pexpOld == NULL ||
				(nStmtNoNew > nStmtNoOld && fOverrideNew) ||
				(nStmtNoOld > nStmtNoNew && !fOverrideOld))
			{
				// For indexed-lookup expressions, we need to make a separate copy 
				// for each individual glyph ID.
				GdlExpression * pexpThisGlyphId = pexpNew;
				if (pexpilNew && pexpilNew->GlyphIndex() != igid)
				{
					//	Make a copy for this specific glyph ID.
					pexpThisGlyphId = pexpNew->Clone();
					GdlClassMemberExpression * pexpilThisGlyphId 
						= dynamic_cast<GdlClassMemberExpression *>(pexpThisGlyphId);
					pexpilThisGlyphId->SetGlyphIndex(igid);
					g_cman.StoreModifiedExpression(pexpThisGlyphId);
				}

				//	The current attribute assignment overrides the previous--set it.
				pgax->Set(m_vwGlyphIDs[iwGlyphID], nGlyphAttrID,
					pexpThisGlyphId, nPRNew, mPrUnitsNew, fOverrideNew, false, lnfNew);
			}

			//	If this glyph is a ligature, add the given component to its list.
			int ivComponent = psym->FieldIndex("component");
			if (ivComponent > -1)
			{
				plclist->AddComponentFor(m_vwGlyphIDs[iwGlyphID],
					psym->Generic()->BaseLigComponent(), prndr);
			}

			igid++;
		}
	}
}